

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_v128.h
# Opt level: O1

v256 * v256_min_s32(v256 a,v256 b)

{
  v256 *in_RDI;
  
  *(uint *)in_RDI->val[1] =
       (uint)((int)b.val[1][0] < (int)a.val[1][0]) * (int)b.val[1][0] |
       (uint)((int)b.val[1][0] >= (int)a.val[1][0]) * (int)a.val[1][0];
  *(uint *)((long)in_RDI->val[1] + 4) =
       (uint)(b.val[1][0]._4_4_ < a.val[1][0]._4_4_) * b.val[1][0]._4_4_ |
       (uint)(b.val[1][0]._4_4_ >= a.val[1][0]._4_4_) * a.val[1][0]._4_4_;
  *(uint *)(in_RDI->val[1] + 1) =
       (uint)((int)b.val[1][1] < (int)a.val[1][1]) * (int)b.val[1][1] |
       (uint)((int)b.val[1][1] >= (int)a.val[1][1]) * (int)a.val[1][1];
  *(uint *)((long)in_RDI->val[1] + 0xc) =
       (uint)(b.val[1][1]._4_4_ < a.val[1][1]._4_4_) * b.val[1][1]._4_4_ |
       (uint)(b.val[1][1]._4_4_ >= a.val[1][1]._4_4_) * a.val[1][1]._4_4_;
  *(uint *)in_RDI->val[0] =
       (uint)((int)b.val[0][0] < (int)a.val[0][0]) * (int)b.val[0][0] |
       (uint)((int)b.val[0][0] >= (int)a.val[0][0]) * (int)a.val[0][0];
  *(uint *)((long)in_RDI->val[0] + 4) =
       (uint)(b.val[0][0]._4_4_ < a.val[0][0]._4_4_) * b.val[0][0]._4_4_ |
       (uint)(b.val[0][0]._4_4_ >= a.val[0][0]._4_4_) * a.val[0][0]._4_4_;
  *(uint *)(in_RDI->val[0] + 1) =
       (uint)((int)b.val[0][1] < (int)a.val[0][1]) * (int)b.val[0][1] |
       (uint)((int)b.val[0][1] >= (int)a.val[0][1]) * (int)a.val[0][1];
  *(uint *)((long)in_RDI->val[0] + 0xc) =
       (uint)(b.val[0][1]._4_4_ < a.val[0][1]._4_4_) * b.val[0][1]._4_4_ |
       (uint)(b.val[0][1]._4_4_ >= a.val[0][1]._4_4_) * a.val[0][1]._4_4_;
  return in_RDI;
}

Assistant:

SIMD_INLINE v256 v256_min_s32(v256 a, v256 b) {
  return v256_from_v128(v128_min_s32(a.val[1], b.val[1]),
                        v128_min_s32(a.val[0], b.val[0]));
}